

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

Ref cashew::ValueBuilder::makeSwitch(Ref input)

{
  char *pcVar1;
  Value *pVVar2;
  Ref RVar3;
  Value *this;
  void *__ptr;
  
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  pVVar2->type = Null;
  pVVar2 = Value::setArray(pVVar2,3);
  __ptr = (void *)0x18;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  (RVar3.inst)->type = Null;
  Value::free(RVar3.inst,__ptr);
  (RVar3.inst)->type = String;
  pcVar1 = _widen;
  ((RVar3.inst)->field_1).str.str._M_len = SWITCH;
  ((RVar3.inst)->field_1).str.str._M_str = pcVar1;
  pVVar2 = Value::push_back(pVVar2,RVar3);
  pVVar2 = Value::push_back(pVVar2,input);
  this = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  this->type = Null;
  RVar3.inst = Value::setArray(this,0);
  RVar3.inst = Value::push_back(pVVar2,RVar3);
  return (Ref)RVar3.inst;
}

Assistant:

static Ref makeSwitch(Ref input) {
    return &makeRawArray(3)
              ->push_back(makeRawString(SWITCH))
              .push_back(input)
              .push_back(makeRawArray());
  }